

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.y
# Opt level: O3

int4 __thiscall CParse::lookupIdentifier(CParse *this,string *nm)

{
  _Rb_tree_color _Var1;
  bool bVar2;
  int iVar3;
  iterator iVar4;
  GRAMMARSTYPE GVar5;
  uint uVar6;
  
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          ::find(&(this->keywords)._M_t,nm);
  if ((_Rb_tree_header *)iVar4._M_node != &(this->keywords)._M_t._M_impl.super__Rb_tree_header) {
    _Var1 = iVar4._M_node[2]._M_color;
    if ((int)_Var1 < 0x80) {
      uVar6 = _Var1 - _S_black;
      if (uVar6 < 0x40) {
        if ((0x808bUL >> ((ulong)uVar6 & 0x3f) & 1) != 0) {
          return 0x10b;
        }
        if ((0x8000000080000000U >> ((ulong)uVar6 & 0x3f) & 1) != 0) {
          return 0x10c;
        }
      }
    }
    else if ((int)_Var1 < 0x200) {
      if (_Var1 == 0x80) {
        return 0x10c;
      }
      if (_Var1 == 0x100) {
        return 0x10d;
      }
    }
    else {
      if (_Var1 == 0x200) {
        return 0x104;
      }
      if (_Var1 == 0x400) {
        return 0x105;
      }
      if (_Var1 == 0x800) {
        return 0x106;
      }
    }
  }
  GVar5.type = TypeFactory::findByName(this->glb->types,nm);
  if (GVar5.dec == (TypeDeclarator *)0x0) {
    bVar2 = Architecture::hasModel(this->glb,nm);
    iVar3 = (uint)bVar2 + (uint)bVar2 * 2 + 0x10a;
  }
  else {
    iVar3 = 0x10e;
    grammarlval.type = GVar5.type;
  }
  return iVar3;
}

Assistant:

int4 CParse::lookupIdentifier(const string &nm)

{
  map<string,uint4>::const_iterator iter = keywords.find(nm);
  if (iter != keywords.end()) {
    switch( (*iter).second ) {
    case f_typedef:
    case f_extern:
    case f_static:
    case f_auto:
    case f_register:
      return STORAGE_CLASS_SPECIFIER;
    case f_const:
    case f_restrict:
    case f_volatile:
      return TYPE_QUALIFIER;
    case f_inline:
      return FUNCTION_SPECIFIER;
    case f_struct:
      return STRUCT;
    case f_union:
      return UNION;
    case f_enum:
      return ENUM;
    default:
      break;
    }
  }
  Datatype *tp = glb->types->findByName(nm);
  if (tp != (Datatype *)0) {
    yylval.type = tp;
    return TYPE_NAME;
  }
  if (glb->hasModel(nm))
    return FUNCTION_SPECIFIER;
  return IDENTIFIER;		// Unknown identifier
}